

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalInterfaceExamples.cpp
# Opt level: O2

void generalInterfaceExamples(void)

{
  ostream *poVar1;
  int h;
  int w;
  Array2D<Imath_3_2::half> gp;
  Array2D<float> zp;
  Array2D<Imath_3_2::half> rp;
  Array2D<GZ> gzp;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\nGZ (green, depth) images\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"drawing image");
  std::endl<char,std::char_traits<char>>(poVar1);
  w = 800;
  h = 600;
  gp._sizeX = 600;
  gp._sizeY = 800;
  gp._data = (half *)operator_new__(960000);
  Imf_3_2::Array2D<float>::Array2D(&zp,600,800);
  drawImage2(&gp,&zp,800,600);
  poVar1 = std::operator<<((ostream *)&std::cout,"writing entire image");
  std::endl<char,std::char_traits<char>>(poVar1);
  writeGZ1("gz1.exr",gp._data,zp._data,800,600);
  poVar1 = std::operator<<((ostream *)&std::cout,"writing cropped image");
  std::endl<char,std::char_traits<char>>(poVar1);
  rp._sizeX = 0x6400000085;
  rp._sizeY = 0x12c00000190;
  writeGZ2("gz2.exr",gp._data,zp._data,800,600,(Box2i *)&rp);
  poVar1 = std::operator<<((ostream *)&std::cout,"reading file into separate per-channel buffers");
  std::endl<char,std::char_traits<char>>(poVar1);
  rp._sizeX = 1;
  rp._sizeY = 1;
  rp._data = (half *)operator_new__(2);
  readGZ1("gz2.exr",&rp,&gp,&zp,&w,&h);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "reading file into interleaved multi-channel buffer");
  std::endl<char,std::char_traits<char>>(poVar1);
  gzp._sizeX = 1;
  gzp._sizeY = 1;
  gzp._data = (GZ *)operator_new__(8);
  readGZ2("gz2.exr",&gzp,&w,&h);
  Imf_3_2::Array2D<GZ>::~Array2D(&gzp);
  Imf_3_2::Array2D<Imath_3_2::half>::~Array2D(&rp);
  Imf_3_2::Array2D<float>::~Array2D(&zp);
  Imf_3_2::Array2D<Imath_3_2::half>::~Array2D(&gp);
  return;
}

Assistant:

void
generalInterfaceExamples ()
{
    cout << "\nGZ (green, depth) images\n" << endl;
    cout << "drawing image" << endl;

    int w = 800;
    int h = 600;

    Array2D<half>  gp (h, w);
    Array2D<float> zp (h, w);
    drawImage2 (gp, zp, w, h);

    cout << "writing entire image" << endl;

    writeGZ1 ("gz1.exr", &gp[0][0], &zp[0][0], w, h);

    cout << "writing cropped image" << endl;

    writeGZ2 (
        "gz2.exr",
        &gp[0][0],
        &zp[0][0],
        w,
        h,
        Box2i (V2i (w / 6, h / 6), V2i (w / 2, h / 2)));

    cout << "reading file into separate per-channel buffers" << endl;

    Array2D<half> rp (1, 1);
    readGZ1 ("gz2.exr", rp, gp, zp, w, h);

    cout << "reading file into interleaved multi-channel buffer" << endl;

    Array2D<GZ> gzp (1, 1);
    readGZ2 ("gz2.exr", gzp, w, h);
}